

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mathtypes.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  tst_vec2();
  tst_mat4();
  tst_mat4_vecx();
  tst_mat4_invert();
  tst_rect2d();
  tst_rect2d_intersect();
  return 0;
}

Assistant:

int main(int, char **)
{
    tst_vec2();
    tst_mat4();
    tst_mat4_vecx();
    tst_mat4_invert();
    tst_rect2d();
    tst_rect2d_intersect();

    return 0;
}